

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestNoExplicitOutput::Run(ParserTestNoExplicitOutput *this)

{
  Test *this_00;
  bool condition;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  string err;
  undefined1 local_70 [8];
  ManifestParser parser;
  ParserTestNoExplicitOutput *this_local;
  
  parser._88_8_ = this;
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)((long)&err.field_2 + 8));
  ManifestParser::ManifestParser
            ((ManifestParser *)local_70,&(this->super_ParserTest).state,(FileReader *)0x0,
             (ManifestParserOptions)err.field_2._8_8_);
  std::__cxx11::string::string((string *)local_98);
  this_00 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"rule cat\n  command = cat $in > $out\nbuild | imp : cat bar\n",
             &local_b9);
  condition = ManifestParser::ParseTest((ManifestParser *)local_70,&local_b8,(string *)local_98);
  testing::Test::Check
            (this_00,condition,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x3fd,
             "parser.ParseTest( \"rule cat\\n\" \"  command = cat $in > $out\\n\" \"build | imp : cat bar\\n\", &err)"
            );
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)local_98);
  return;
}

Assistant:

TEST_F(ParserTest, NoExplicitOutput) {
  ManifestParser parser(&state, NULL);
  string err;
  EXPECT_TRUE(parser.ParseTest(
"rule cat\n"
"  command = cat $in > $out\n"
"build | imp : cat bar\n", &err));
}